

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O1

Bool Line_To(black_PWorker worker,Long x,Long y)

{
  Long *pLVar1;
  ulong uVar2;
  long lVar3;
  Bool BVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  TStates TVar8;
  
  TVar8 = worker->state;
  if (TVar8 == Descending_State) {
    lVar3 = worker->lastY;
    if (lVar3 < y) {
      BVar4 = End_Profile(worker,(long)worker->precision_half <=
                                 (long)((-(long)worker->precision & (lVar3 + worker->precision) - 1U
                                        ) - lVar3));
      if (BVar4 != '\0') {
        return '\x01';
      }
      bVar7 = (long)worker->precision_half <=
              (long)((-(long)worker->precision & (worker->lastY + (long)worker->precision) - 1U) -
                    worker->lastY);
      TVar8 = Ascending_State;
LAB_00240749:
      cVar5 = New_Profile(worker,TVar8,bVar7);
LAB_0024077a:
      if (cVar5 != '\0') {
        return '\x01';
      }
    }
  }
  else if (TVar8 == Ascending_State) {
    if (y < worker->lastY) {
      BVar4 = End_Profile(worker,(long)worker->precision_half <=
                                 (worker->lastY & (long)(worker->precision + -1)));
      if (BVar4 != '\0') {
        return '\x01';
      }
      bVar7 = (long)worker->precision_half <= ((long)(worker->precision + -1) & worker->lastY);
      TVar8 = Descending_State;
      goto LAB_00240749;
    }
  }
  else if (TVar8 == Unknown_State) {
    uVar2 = worker->lastY;
    if ((long)uVar2 < y) {
      bVar7 = (long)worker->precision_half <=
              (long)((-(long)worker->precision & (uVar2 + (long)worker->precision) - 1) - uVar2);
      TVar8 = Ascending_State;
    }
    else {
      if ((long)uVar2 <= y) goto LAB_00240782;
      bVar7 = (long)worker->precision_half <= (long)(uVar2 & (long)(worker->precision + -1));
      TVar8 = Descending_State;
    }
    cVar5 = New_Profile(worker,TVar8,bVar7);
    goto LAB_0024077a;
  }
LAB_00240782:
  if (worker->state == Descending_State) {
    cVar5 = worker->fresh;
    cVar6 = Line_Up(worker,worker->lastX,-worker->lastY,x,-y,-worker->maxY,-worker->minY);
    if ((cVar5 != '\0') && (worker->fresh == '\0')) {
      pLVar1 = &worker->cProfile->start;
      *pLVar1 = -*pLVar1;
    }
  }
  else {
    if (worker->state != Ascending_State) goto LAB_00240805;
    cVar6 = Line_Up(worker,worker->lastX,worker->lastY,x,y,worker->minY,worker->maxY);
  }
  if (cVar6 != '\0') {
    return '\x01';
  }
LAB_00240805:
  worker->lastX = x;
  worker->lastY = y;
  return '\0';
}

Assistant:

static Bool
  Line_To( RAS_ARGS Long  x,
                    Long  y )
  {
    /* First, detect a change of direction */

    switch ( ras.state )
    {
    case Unknown_State:
      if ( y > ras.lastY )
      {
        if ( New_Profile( RAS_VARS Ascending_State,
                                   IS_BOTTOM_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      else
      {
        if ( y < ras.lastY )
          if ( New_Profile( RAS_VARS Descending_State,
                                     IS_TOP_OVERSHOOT( ras.lastY ) ) )
            return FAILURE;
      }
      break;

    case Ascending_State:
      if ( y < ras.lastY )
      {
        if ( End_Profile( RAS_VARS IS_TOP_OVERSHOOT( ras.lastY ) ) ||
             New_Profile( RAS_VARS Descending_State,
                                   IS_TOP_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      break;

    case Descending_State:
      if ( y > ras.lastY )
      {
        if ( End_Profile( RAS_VARS IS_BOTTOM_OVERSHOOT( ras.lastY ) ) ||
             New_Profile( RAS_VARS Ascending_State,
                                   IS_BOTTOM_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      break;

    default:
      ;
    }

    /* Then compute the lines */

    switch ( ras.state )
    {
    case Ascending_State:
      if ( Line_Up( RAS_VARS ras.lastX, ras.lastY,
                             x, y, ras.minY, ras.maxY ) )
        return FAILURE;
      break;

    case Descending_State:
      if ( Line_Down( RAS_VARS ras.lastX, ras.lastY,
                               x, y, ras.minY, ras.maxY ) )
        return FAILURE;
      break;

    default:
      ;
    }

    ras.lastX = x;
    ras.lastY = y;

    return SUCCESS;
  }